

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall embree::TutorialApplication::initRayStats(TutorialApplication *this)

{
  int iVar1;
  size_t in_RDI;
  size_t i;
  size_t in_stack_fffffffffffffff0;
  ulong uVar2;
  ulong uVar3;
  
  if (g_stats == (RayStats *)0x0) {
    tbb::detail::d1::max_concurrency();
    g_stats = (RayStats *)alignedMalloc(in_RDI,in_stack_fffffffffffffff0);
  }
  uVar2 = 0;
  while( true ) {
    uVar3 = uVar2;
    iVar1 = tbb::detail::d1::max_concurrency();
    if ((ulong)(long)iVar1 <= uVar2) break;
    g_stats[uVar3].numRays = 0;
    uVar2 = uVar3 + 1;
  }
  return;
}

Assistant:

void TutorialApplication::initRayStats()
  {
    if (!g_stats)
      g_stats = (RayStats*)alignedMalloc(TaskScheduler::threadCount() * sizeof(RayStats), 64);

    for (size_t i = 0; i < TaskScheduler::threadCount(); i++)
      g_stats[i].numRays = 0;
  }